

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

bc_slist_t * bc_slist_append(bc_slist_t *l,void *data)

{
  bc_slist_t *local_28;
  bc_slist_t *tmp;
  bc_slist_t *node;
  void *data_local;
  bc_slist_t *l_local;
  
  data_local = bc_malloc(0x10);
  ((_bc_slist_t *)data_local)->data = data;
  ((_bc_slist_t *)data_local)->next = (_bc_slist_t *)0x0;
  local_28 = l;
  if (l != (bc_slist_t *)0x0) {
    for (; local_28->next != (_bc_slist_t *)0x0; local_28 = local_28->next) {
    }
    local_28->next = (_bc_slist_t *)data_local;
    data_local = l;
  }
  return (bc_slist_t *)data_local;
}

Assistant:

bc_slist_t*
bc_slist_append(bc_slist_t *l, void *data)
{
    bc_slist_t *node = bc_malloc(sizeof(bc_slist_t));
    node->data = data;
    node->next = NULL;
    if (l == NULL) {
        l = node;
    }
    else {
        bc_slist_t *tmp;
        for (tmp = l; tmp->next != NULL; tmp = tmp->next);
        tmp->next = node;
    }
    return l;
}